

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiHand::RemoveFromHand
          (HanabiHand *this,int card_index,
          vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          *discard_pile)

{
  if (discard_pile !=
      (vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *)
      0x0) {
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    push_back(discard_pile,
              (this->cards_).
              super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ._M_impl.super__Vector_impl_data._M_start + card_index);
  }
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  erase(&this->cards_,
        (this->cards_).
        super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
        ._M_impl.super__Vector_impl_data._M_start + card_index);
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::erase(&this->card_knowledge_,
          (this->card_knowledge_).
          super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
          ._M_impl.super__Vector_impl_data._M_start + card_index);
  return;
}

Assistant:

void HanabiHand::RemoveFromHand(int card_index,
                                std::vector<HanabiCard>* discard_pile) {
  if (discard_pile != nullptr) {
    discard_pile->push_back(cards_[card_index]);
  }
  cards_.erase(cards_.begin() + card_index);
  card_knowledge_.erase(card_knowledge_.begin() + card_index);
}